

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

void __thiscall
pixels::compareClose(pixels *this,pixels *o,exr_compression_t comp,char *otag,char *selftag)

{
  short *psVar1;
  short *psVar2;
  pointer pfVar3;
  pointer pfVar4;
  int iVar5;
  bool bVar6;
  ulong uVar7;
  ostream *poVar8;
  uint uVar9;
  char *pcVar11;
  pointer puVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  pointer puVar16;
  pointer puVar17;
  uint16_t *puVar18;
  pointer puVar19;
  uint16_t *puVar20;
  pointer puVar21;
  int y1;
  long lVar22;
  pointer puVar23;
  uint uVar24;
  uint uVar25;
  pointer puVar26;
  pointer puVar27;
  int y;
  int iVar28;
  int iVar29;
  long lVar30;
  int x1;
  long lVar31;
  pointer puVar32;
  long lVar33;
  pointer puVar34;
  uint16_t unc [4] [4];
  uint16_t orig [4] [4];
  uint16_t local_78 [16];
  uint16_t local_58 [20];
  char *pcVar10;
  
  iVar28 = 0;
  while( true ) {
    uVar9 = this->_h;
    if ((int)uVar9 <= iVar28) break;
    for (lVar14 = 0; iVar13 = (int)lVar14, iVar13 < this->_w; lVar14 = lVar14 + 1) {
      lVar33 = (long)this->_stride_x * (long)iVar28 + lVar14;
      compareExact((o->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar33],
                   (this->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar33],iVar13,iVar28,otag,selftag,"I");
      pfVar3 = (o->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar4 = (this->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (comp == EXR_COMPRESSION_PXR24) {
        uVar9 = (((uint)pfVar3[lVar33] >> 8) - ((uint)pfVar4[lVar33] >> 8)) + 1;
        pcVar10 = (char *)(ulong)uVar9;
        if (2 < uVar9) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"At ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar13);
          poVar8 = std::operator<<(poVar8,", ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar28);
          std::operator<<(poVar8,":\n");
          core_test_fail("delta < 2 && delta > -2",(char *)0x247,0x156b01,pcVar10);
        }
      }
      else {
        compareExact(pfVar3[lVar33],pfVar4[lVar33],iVar13,iVar28,otag,selftag,"F");
      }
    }
    iVar28 = iVar28 + 1;
  }
  if ((comp & ~EXR_COMPRESSION_RLE) == EXR_COMPRESSION_B44) {
    for (lVar14 = 0; lVar14 < (int)uVar9; lVar14 = lVar14 + 4) {
      for (lVar33 = 0; lVar33 < this->_w; lVar33 = lVar33 + 4) {
        iVar28 = this->_stride_x;
        uVar9 = this->_h - 1;
        pcVar10 = (char *)(ulong)uVar9;
        iVar13 = this->_w + -1;
        puVar16 = (o->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                  .super__Vector_impl_data._M_start;
        puVar17 = (this->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar18 = local_78;
        puVar20 = local_58;
        for (lVar22 = 0; uVar24 = (uint)lVar14, iVar5 = (int)lVar33, lVar22 != 4;
            lVar22 = lVar22 + 1) {
          uVar24 = (uint)lVar22 | uVar24;
          if ((int)uVar9 < (int)uVar24) {
            uVar24 = uVar9;
          }
          for (lVar31 = 0; lVar31 != 4; lVar31 = lVar31 + 1) {
            iVar29 = iVar5 + (int)lVar31;
            if (iVar13 < iVar29) {
              iVar29 = iVar13;
            }
            iVar29 = iVar29 + uVar24 * iVar28;
            puVar20[lVar31] = puVar16[iVar29];
            puVar18[lVar31] = puVar17[iVar29];
          }
          puVar20 = puVar20 + 4;
          puVar18 = puVar18 + 4;
        }
        bVar6 = withinB44ErrorBounds((uint16_t (*) [4])local_58,(uint16_t (*) [4])local_78);
        if (!bVar6) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"At ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
          poVar8 = std::operator<<(poVar8,", ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar24);
          std::operator<<(poVar8,":\n");
          core_test_fail("withinB44ErrorBounds (orig, unc)",(char *)0x263,0x156b01,pcVar10);
        }
        lVar22 = 0;
        while (lVar22 != 4) {
          uVar9 = this->_h - 1;
          pcVar10 = (char *)(ulong)uVar9;
          iVar13 = this->_w + -1;
          iVar28 = this->_stride_x;
          puVar16 = o->rgba[lVar22].
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar17 = this->rgba[lVar22].
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar18 = local_78;
          puVar20 = local_58;
          for (lVar31 = 0; lVar31 != 4; lVar31 = lVar31 + 1) {
            uVar25 = (uint)lVar31 | uVar24;
            if ((int)uVar9 < (int)uVar25) {
              uVar25 = uVar9;
            }
            for (lVar30 = 0; lVar30 != 4; lVar30 = lVar30 + 1) {
              iVar29 = iVar5 + (int)lVar30;
              if (iVar13 < iVar29) {
                iVar29 = iVar13;
              }
              iVar29 = iVar29 + uVar25 * iVar28;
              puVar20[lVar30] = puVar16[iVar29];
              puVar18[lVar30] = puVar17[iVar29];
            }
            puVar20 = puVar20 + 4;
            puVar18 = puVar18 + 4;
          }
          bVar6 = withinB44ErrorBounds((uint16_t (*) [4])local_58,(uint16_t (*) [4])local_78);
          lVar22 = lVar22 + 1;
          if (!bVar6) {
            poVar8 = std::operator<<((ostream *)&std::cerr,"At ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
            poVar8 = std::operator<<(poVar8,", ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar24);
            std::operator<<(poVar8,":\n");
            core_test_fail("withinB44ErrorBounds (orig, unc)",(char *)0x272,0x156b01,pcVar10);
          }
        }
      }
      uVar9 = this->_h;
    }
  }
  else if ((comp & ~EXR_COMPRESSION_RLE) == EXR_COMPRESSION_DWAA) {
    for (iVar28 = 0; iVar28 < (int)uVar9; iVar28 = iVar28 + 1) {
      for (iVar13 = 0; iVar13 < this->_w; iVar13 = iVar13 + 1) {
        lVar14 = (long)(this->_stride_x * iVar28 + iVar13);
        compareExact((o->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar14],
                     (this->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar14],iVar13,iVar28,otag,selftag,"H"
                    );
        pcVar10 = (char *)0x0;
        while (pcVar11 = pcVar10 + 0x18, pcVar11 != (char *)0x78) {
          bVar6 = withinDWAErrorBounds
                            (*(uint16_t *)
                              (*(long *)(pcVar10 +
                                        (long)&o->rgba[0].
                                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                        ) + lVar14 * 2),
                             *(uint16_t *)
                              (*(long *)(pcVar10 +
                                        (long)&this->rgba[0].
                                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                        ) + lVar14 * 2));
          pcVar10 = pcVar11;
          if (!bVar6) {
            poVar8 = std::operator<<((ostream *)&std::cerr,"At ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar13);
            poVar8 = std::operator<<(poVar8,", ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar28);
            std::operator<<(poVar8,":\n");
            core_test_fail("withinDWAErrorBounds (o.rgba[c][idx], rgba[c][idx])",(char *)0x285,
                           0x156b01,pcVar11);
          }
        }
      }
      uVar9 = this->_h;
    }
  }
  else if (comp == EXR_COMPRESSION_PXR24) {
    for (iVar28 = 0; iVar28 < (int)uVar9; iVar28 = iVar28 + 1) {
      for (lVar14 = 0; iVar13 = (int)lVar14, iVar13 < this->_w; lVar14 = lVar14 + 1) {
        lVar33 = (long)this->_stride_x * (long)iVar28 + lVar14;
        compareExact((o->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar33],
                     (this->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar33],iVar13,iVar28,otag,selftag,"H"
                    );
        compareExact(o->rgba[0].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar33],
                     this->rgba[0].
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar33],iVar13,iVar28,otag,selftag,"R");
        compareExact(o->rgba[1].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar33],
                     this->rgba[1].
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar33],iVar13,iVar28,otag,selftag,"G");
        compareExact(o->rgba[2].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar33],
                     this->rgba[2].
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar33],iVar13,iVar28,otag,selftag,"B");
        compareExact(o->rgba[3].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar33],
                     this->rgba[3].
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar33],iVar13,iVar28,otag,selftag,"A");
      }
      uVar9 = this->_h;
    }
  }
  else {
    iVar28 = this->_stride_x;
    puVar16 = (o->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar17 = o->rgba[0].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
              .super__Vector_impl_data._M_start;
    puVar19 = (this->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar21 = this->rgba[0].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar23 = o->rgba[1].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
              .super__Vector_impl_data._M_start;
    puVar26 = this->rgba[1].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar32 = o->rgba[2].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
              .super__Vector_impl_data._M_start;
    puVar34 = this->rgba[2].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar27 = o->rgba[3].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
              .super__Vector_impl_data._M_start;
    puVar12 = this->rgba[3].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar15 = 0;
    iVar13 = this->_w;
    if (this->_w < 1) {
      iVar13 = 0;
    }
    uVar7 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar7 = uVar15;
    }
    pcVar10 = (char *)(ulong)(uint)(iVar13 * 2);
    for (; uVar15 != uVar7; uVar15 = uVar15 + 1) {
      pcVar11 = (char *)0x0;
      while (pcVar10 != pcVar11) {
        if (*(short *)(pcVar11 + (long)puVar16) != *(short *)(pcVar11 + (long)puVar19)) {
          core_test_fail("o.h[idx] == h[idx]",(char *)0x2a4,0x156b01,pcVar10);
        }
        if (*(short *)(pcVar11 + (long)puVar17) != *(short *)(pcVar11 + (long)puVar21)) {
          core_test_fail("o.rgba[0][idx] == rgba[0][idx]",(char *)0x2a5,0x156b01,pcVar10);
        }
        if (*(short *)(pcVar11 + (long)puVar23) != *(short *)(pcVar11 + (long)puVar26)) {
          core_test_fail("o.rgba[1][idx] == rgba[1][idx]",(char *)0x2a6,0x156b01,pcVar10);
        }
        if (*(short *)(pcVar11 + (long)puVar32) != *(short *)(pcVar11 + (long)puVar34)) {
          core_test_fail("o.rgba[2][idx] == rgba[2][idx]",(char *)0x2a7,0x156b01,pcVar10);
        }
        psVar1 = (short *)(pcVar11 + (long)puVar27);
        psVar2 = (short *)(pcVar11 + (long)puVar12);
        pcVar11 = pcVar11 + 2;
        if (*psVar1 != *psVar2) {
          core_test_fail("o.rgba[3][idx] == rgba[3][idx]",(char *)0x2a8,0x156b01,pcVar10);
        }
      }
      puVar16 = puVar16 + iVar28;
      puVar19 = puVar19 + iVar28;
      puVar17 = puVar17 + iVar28;
      puVar21 = puVar21 + iVar28;
      puVar23 = puVar23 + iVar28;
      puVar26 = puVar26 + iVar28;
      puVar32 = puVar32 + iVar28;
      puVar34 = puVar34 + iVar28;
      puVar27 = puVar27 + iVar28;
      puVar12 = puVar12 + iVar28;
    }
  }
  return;
}

Assistant:

void compareClose (
        const pixels&     o,
        exr_compression_t comp,
        const char*       otag,
        const char*       selftag) const
    {
        for (int y = 0; y < _h; ++y)
        {
            for (int x = 0; x < _w; ++x)
            {
                size_t idx = y * _stride_x + x;

                compareExact (o.i[idx], i[idx], x, y, otag, selftag, "I");

                if (comp == EXR_COMPRESSION_PXR24)
                {
                    union
                    {
                        uint32_t iv;
                        float    fv;
                    } a, b;
                    a.fv = o.f[idx];
                    b.fv = f[idx];
                    int32_t delta =
                        (int32_t) (a.iv >> 8) - (int32_t) (b.iv >> 8);
                    EXRCORE_TEST_LOCATION (delta < 2 && delta > -2, x, y);
                }
                else
                {
                    // b44 & dwa don't change floats
                    compareExact (o.f[idx], f[idx], x, y, otag, selftag, "F");
                }
            }
        }

        if (comp == EXR_COMPRESSION_B44 || comp == EXR_COMPRESSION_B44A)
        {
            uint16_t orig[4][4], unc[4][4];
            for (int y = 0; y < _h; y += 4)
            {
                for (int x = 0; x < _w; x += 4)
                {
                    for (int y1 = 0; y1 < 4; ++y1)
                    {
                        for (int x1 = 0; x1 < 4; ++x1)
                        {
                            int y2       = std::min (y + y1, _h - 1);
                            int x2       = std::min (x + x1, _w - 1);
                            orig[y1][x1] = o.h[y2 * _stride_x + x2];
                            unc[y1][x1]  = h[y2 * _stride_x + x2];
                        }
                    }
                    EXRCORE_TEST_LOCATION (
                        withinB44ErrorBounds (orig, unc), x, y)
                    for (int c = 0; c < 4; ++c)
                    {

                        for (int y1 = 0; y1 < 4; ++y1)
                        {
                            for (int x1 = 0; x1 < 4; ++x1)
                            {
                                int y2       = std::min (y + y1, _h - 1);
                                int x2       = std::min (x + x1, _w - 1);
                                orig[y1][x1] = o.rgba[c][y2 * _stride_x + x2];
                                unc[y1][x1]  = rgba[c][y2 * _stride_x + x2];
                            }
                        }
                        EXRCORE_TEST_LOCATION (
                            withinB44ErrorBounds (orig, unc), x, y)
                    }
                }
            }
        }
        else if (comp == EXR_COMPRESSION_DWAA || comp == EXR_COMPRESSION_DWAB)
        {
            for (int y = 0; y < _h; ++y)
            {
                for (int x = 0; x < _w; ++x)
                {
                    size_t idx = y * _stride_x + x;
                    compareExact (o.h[idx], h[idx], x, y, otag, selftag, "H");

                    for (int c = 0; c < 4; ++c)
                    {
                        EXRCORE_TEST_LOCATION (
                            withinDWAErrorBounds (o.rgba[c][idx], rgba[c][idx]),
                            x,
                            y)
                    }
                }
            }
        }
        else if (comp == EXR_COMPRESSION_PXR24)
        {
            for (int y = 0; y < _h; ++y)
            {
                for (int x = 0; x < _w; ++x)
                {
                    size_t idx = y * _stride_x + x;
                    compareExact (o.h[idx], h[idx], x, y, otag, selftag, "H");
                    compareExact (
                        o.rgba[0][idx], rgba[0][idx], x, y, otag, selftag, "R");
                    compareExact (
                        o.rgba[1][idx], rgba[1][idx], x, y, otag, selftag, "G");
                    compareExact (
                        o.rgba[2][idx], rgba[2][idx], x, y, otag, selftag, "B");
                    compareExact (
                        o.rgba[3][idx], rgba[3][idx], x, y, otag, selftag, "A");
                }
            }
        }
        else
        {
            for (int y = 0; y < _h; ++y)
            {
                for (int x = 0; x < _w; ++x)
                {
                    size_t idx = y * _stride_x + x;
                    EXRCORE_TEST (o.h[idx] == h[idx]);
                    EXRCORE_TEST (o.rgba[0][idx] == rgba[0][idx]);
                    EXRCORE_TEST (o.rgba[1][idx] == rgba[1][idx]);
                    EXRCORE_TEST (o.rgba[2][idx] == rgba[2][idx]);
                    EXRCORE_TEST (o.rgba[3][idx] == rgba[3][idx]);
                }
            }
        }
    }